

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddExtension<google::protobuf::FieldDescriptorProto>
          (DescriptorIndex *this,string_view filename,FieldDescriptorProto *field)

{
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  __first;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  __last;
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  LogMessage *pLVar4;
  long *plVar5;
  char *pcVar6;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  int32_t local_88;
  char *local_80;
  size_t local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_70;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*>,_bool>
  local_48;
  
  local_78 = filename._M_len;
  plVar5 = (long *)((ulong)(field->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  bVar2 = true;
  if ((plVar5[1] != 0) && (*(char *)*plVar5 == '.')) {
    local_b0._0_4_ =
         (int)((ulong)((long)(this->all_values_).
                             super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->all_values_).
                            super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 + -1;
    local_a8._M_p = (pointer)&local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,*plVar5,plVar5[1] + *plVar5)
    ;
    local_88 = (field->field_0)._impl_.number_;
    absl::lts_20250127::container_internal::
    btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,256,false>>
    ::
    insert_unique<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>
              (&local_48,&this->by_extension_,(ExtensionEntry *)local_b0,(ExtensionEntry *)local_b0)
    ;
    bVar3 = true;
    pcVar6 = filename._M_str;
    if (local_48.second == true) {
      __first._M_current =
           (this->by_extension_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this->by_extension_flat_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_80 = filename._M_str;
      std::__cxx11::string::substr
                ((ulong)&local_d0,
                 (ulong)(field->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      local_70.second = (field->field_0)._impl_.number_;
      local_70.first._M_dataplus._M_p = (pointer)&local_70.first.field_2;
      if (local_d0 == &local_c0) {
        local_70.first.field_2._8_8_ = local_c0._8_8_;
      }
      else {
        local_70.first._M_dataplus._M_p = (pointer)local_d0;
      }
      local_70.first.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
      local_70.first.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
      local_70.first._M_string_length = local_c8;
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      local_d0 = &local_c0;
      bVar3 = std::
              binary_search<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::pair<std::__cxx11::string,int>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                        (__first,__last,&local_70,
                         (this->by_extension_).
                         super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                         .
                         super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                         .tree_.rightmost_.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>::checked_compare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::key_compare_adapter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>::checked_compare,_0UL,_false>
                         .value.
                         super_checked_compare_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_true>
                         .super_ExtensionCompare.index);
      pcVar6 = local_80;
    }
    if (local_48.second != false) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
        operator_delete(local_70.first._M_dataplus._M_p,
                        local_70.first.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,
                                          local_c0._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_p != &local_98) {
      operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
    }
    sVar1 = local_78;
    bVar2 = true;
    if (bVar3 != false) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0x319);
      str._M_str = "Extension conflicts with extension already in database: extend ";
      str._M_len = 0x3f;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)local_b0,str);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         ((LogMessage *)local_b0,
                          (string *)
                          ((ulong)(field->field_0)._impl_.extendee_.tagged_ptr_.ptr_ &
                          0xfffffffffffffffc));
      str_00._M_str = " { ";
      str_00._M_len = 3;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar4,str_00);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar4,(string *)
                                 ((ulong)(field->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                 0xfffffffffffffffc));
      str_01._M_str = " = ";
      str_01._M_len = 3;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar4,str_01);
      local_48.first.node_._0_4_ = (field->field_0)._impl_.number_;
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                         (pLVar4,(int *)&local_48);
      str_02._M_str = " } from:";
      str_02._M_len = 8;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (pLVar4,str_02);
      v._M_str = pcVar6;
      v._M_len = sVar1;
      absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,v);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)local_b0);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddExtension(
    absl::string_view filename, const FieldProto& field) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!by_extension_
             .insert({static_cast<int>(all_values_.size() - 1),
                      EncodeString(field.extendee()), field.number()})
             .second ||
        std::binary_search(
            by_extension_flat_.begin(), by_extension_flat_.end(),
            std::make_pair(field.extendee().substr(1), field.number()),
            by_extension_.key_comp())) {
      ABSL_LOG(ERROR)
          << "Extension conflicts with extension already in database: "
             "extend "
          << field.extendee() << " { " << field.name() << " = "
          << field.number() << " } from:" << filename;
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}